

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O2

void __thiscall
llbuild::basic::StringList::StringList<llvm::StringRef>
          (StringList *this,ArrayRef<llvm::StringRef> values)

{
  size_t __n;
  long lVar1;
  char *__dest;
  void *pvVar2;
  StringRef *pSVar3;
  StringRef *pSVar4;
  uint64_t uVar5;
  char *pcVar6;
  
  pSVar4 = values.Data;
  this->contents = (char *)0x0;
  this->size = 0;
  uVar5 = 0;
  pSVar3 = pSVar4;
  for (lVar1 = values.Length << 4; lVar1 != 0; lVar1 = lVar1 + -0x10) {
    uVar5 = uVar5 + pSVar3->Length + 1;
    this->size = uVar5;
    pSVar3 = pSVar3 + 1;
  }
  __dest = (char *)operator_new__(uVar5 + 1);
  this->contents = __dest;
  lVar1 = values.Length << 4;
  do {
    if (lVar1 == 0) {
      *__dest = '\0';
      return;
    }
    pcVar6 = pSVar4->Data;
    __n = pSVar4->Length;
    if (__n != 0) {
      pvVar2 = memchr(pcVar6,0,__n);
      if ((long)pvVar2 - (long)pcVar6 != -1 && pvVar2 != (void *)0x0) {
        __assert_fail("value.find(\'\\0\') == StringRef::npos",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/StringList.h"
                      ,0x40,
                      "llbuild::basic::StringList::StringList(const ArrayRef<StringType>) [StringType = llvm::StringRef]"
                     );
      }
    }
    memcpy(__dest,pcVar6,__n);
    pcVar6 = __dest + __n;
    __dest = pcVar6 + 1;
    *pcVar6 = '\0';
    pSVar4 = pSVar4 + 1;
    lVar1 = lVar1 + -0x10;
  } while( true );
}

Assistant:

explicit StringList(const ArrayRef<StringType> values) {
    // Construct the concatenated data.
    for (auto value: values) {
      size += value.size() + 1;
    }
    // Make sure to allocate at least 1 byte.
    char* p = nullptr;
    contents = p = new char[size + 1];
    for (auto value: values) {
      assert(value.find('\0') == StringRef::npos);
      memcpy(p, value.data(), value.size());
      p += value.size();
      *p++ = '\0';
    }
    *p = '\0';
  }